

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableStringFieldGenerator::GenerateBuilderParsingCode
          (ImmutableStringFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  char *pcVar2;
  string_view text;
  size_t sStack_20;
  
  bVar1 = CheckUtf8(this->descriptor_);
  if (bVar1) {
    pcVar2 = "$name$_ = input.readStringRequireUtf8();\n$set_has_field_bit_builder$\n";
    sStack_20 = 0x45;
  }
  else {
    pcVar2 = "$name$_ = input.readBytes();\n$set_has_field_bit_builder$\n";
    sStack_20 = 0x39;
  }
  text._M_str = pcVar2;
  text._M_len = sStack_20;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&this->variables_,text);
  return;
}

Assistant:

void ImmutableStringFieldGenerator::GenerateBuilderParsingCode(
    io::Printer* printer) const {
  if (CheckUtf8(descriptor_)) {
    printer->Print(variables_,
                   "$name$_ = input.readStringRequireUtf8();\n"
                   "$set_has_field_bit_builder$\n");
  } else {
    printer->Print(variables_,
                   "$name$_ = input.readBytes();\n"
                   "$set_has_field_bit_builder$\n");
  }
}